

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

void __thiscall crn::corpus_tester::flush_bad_blocks(corpus_tester *this)

{
  char *pcVar1;
  dynamic_string filename;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_14;
  
  if (this->m_next_bad_block_index != 0) {
    crnlib::dynamic_string::dynamic_string
              (&filename,cVarArg,"badblocks_%u.tga",(ulong)this->m_total_bad_block_files);
    pcVar1 = filename.m_pStr;
    if (filename.m_pStr == (char *)0x0) {
      pcVar1 = "";
    }
    crnlib::console::printf("Writing bad block image: %s",pcVar1);
    pcVar1 = "";
    if (filename.m_pStr != (char *)0x0) {
      pcVar1 = filename.m_pStr;
    }
    crnlib::image_utils::write_to_file(pcVar1,&this->m_bad_block_img,1,-1);
    local_14.m_u32 = 0xff000000;
    crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_all
              (&this->m_bad_block_img,(color_quad<unsigned_char,_int> *)&local_14.field_0);
    this->m_total_bad_block_files = this->m_total_bad_block_files + 1;
    this->m_next_bad_block_index = 0;
    crnlib::dynamic_string::~dynamic_string(&filename);
  }
  return;
}

Assistant:

void corpus_tester::flush_bad_blocks()
    {
        if (!m_next_bad_block_index)
        {
            return;
        }
        dynamic_string filename(cVarArg, "badblocks_%u.tga", m_total_bad_block_files);
        console::printf("Writing bad block image: %s", filename.get_ptr());
        image_utils::write_to_file(filename.get_ptr(), m_bad_block_img, image_utils::cWriteFlagIgnoreAlpha);

        m_bad_block_img.set_all(color_quad_u8::make_black());

        m_total_bad_block_files++;

        m_next_bad_block_index = 0;
    }